

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O0

int bb_depends_on(basic_block *target,basic_block *src)

{
  int iVar1;
  undefined1 local_40 [8];
  ptr_list_iter pseudoiter__;
  pseudo_t pseudo;
  basic_block *src_local;
  basic_block *target_local;
  
  ptrlist_forward_iterator((ptr_list_iter *)local_40,(ptr_list *)src->defines);
  pseudoiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_40);
  while( true ) {
    if (pseudoiter__._16_8_ == 0) {
      return 0;
    }
    iVar1 = dmrC_pseudo_in_list(target->needs,(pseudo_t)pseudoiter__._16_8_);
    if (iVar1 != 0) break;
    pseudoiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_40);
  }
  return 1;
}

Assistant:

static int bb_depends_on(struct basic_block *target, struct basic_block *src)
{
	pseudo_t pseudo;

	FOR_EACH_PTR(src->defines, pseudo) {
		if (dmrC_pseudo_in_list(target->needs, pseudo))
			return 1;
	} END_FOR_EACH_PTR(pseudo);
	return 0;
}